

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utils.cpp
# Opt level: O3

ostream * wv::operator<<(ostream *os,sentence *sent)

{
  pointer pbVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  if ((sent->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (sent->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
      pbVar1 = (sent->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,*(char **)((long)pbVar1 + lVar5 + -8),
                          *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar5));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'",1);
      uVar3 = (long)(sent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(sent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
      if (uVar4 != uVar3 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar3 = (long)(sent->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(sent->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar4 < uVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const sentence& sent) {
    os << "[";
    for(size_t i=0; i<sent.size(); ++i){
        os << "'" << sent[i] << "'";
        if(i != sent.size()-1)
            os << " ";
    }
    os << "]";
    return os;
}